

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O3

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  RK_S32 RVar2;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_slots_get_unused_count");
    RVar2 = -3;
  }
  else {
    __mutex = *slots;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    iVar1 = *(int *)((long)slots + 100);
    if ((iVar1 < 0) ||
       (RVar2 = *(int *)((long)slots + 0x60) - iVar1, *(int *)((long)slots + 0x60) < iVar1)) {
      _dump_slots("mpp_slots_get_unused_count",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(impl->used_count >= 0) && (impl->used_count <= impl->buf_count)",
                 "mpp_slots_get_unused_count",0x53c);
      abort();
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return RVar2;
}

Assistant:

RK_S32 mpp_slots_get_unused_count(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (impl->used_count >= 0) && (impl->used_count <= impl->buf_count));
    return impl->buf_count - impl->used_count;
}